

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

bool __thiscall
VertexAttrib64Bit::GetVertexAttribTest::verifyResults
          (GetVertexAttribTest *this,GLdouble *set_values,GLuint length,GLuint index,
          char *function_name,int line_number)

{
  double dVar1;
  ulong uVar2;
  GLenum err;
  ulong uVar3;
  bool bVar4;
  GLdouble results [4];
  GLdouble local_58;
  double adStack_50 [4];
  
  adStack_50[1] = 0.0;
  adStack_50[2] = 0.0;
  local_58 = 0.0;
  adStack_50[0] = 0.0;
  (*(this->super_Base).gl.getVertexAttribLdv)(index,0x8626,&local_58);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"GetVertexAttribLdv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x477);
  bVar4 = length == 0;
  if (!bVar4) {
    dVar1 = this->m_epsilon;
    bVar4 = false;
    if ((local_58 <= dVar1 + *set_values) && (*set_values - dVar1 <= local_58)) {
      uVar2 = 1;
      while (uVar3 = uVar2, length != uVar3) {
        if ((dVar1 + set_values[uVar3] < adStack_50[uVar3 - 1]) ||
           (uVar2 = uVar3 + 1, adStack_50[uVar3 - 1] < set_values[uVar3] - dVar1)) break;
      }
      bVar4 = length <= uVar3;
    }
  }
  if (bVar4 == false) {
    logError(this,set_values,&local_58,length,function_name,index,line_number);
  }
  return bVar4;
}

Assistant:

bool GetVertexAttribTest::verifyResults(const GLdouble* set_values, GLuint length, GLuint index,
										const char* function_name, int line_number) const
{
	GLdouble results[4] = { 0.0, 0.0, 0.0, 0.0 };

	gl.getVertexAttribLdv(index, GL_CURRENT_VERTEX_ATTRIB, results);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribLdv");

	if (false == compareDoubles(set_values, results, length))
	{
		logError(set_values, results, length, function_name, index, line_number);

		return false;
	}

	return true;
}